

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

ArrayBuilder<kj::AncillaryMessage> * __thiscall
kj::ArrayBuilder<kj::AncillaryMessage>::operator=
          (ArrayBuilder<kj::AncillaryMessage> *this,ArrayBuilder<kj::AncillaryMessage> *other)

{
  ArrayBuilder<kj::AncillaryMessage> *other_local;
  ArrayBuilder<kj::AncillaryMessage> *this_local;
  
  dispose(this);
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (AncillaryMessage *)0x0;
  other->pos = (RemoveConst<kj::AncillaryMessage> *)0x0;
  other->endPtr = (AncillaryMessage *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }